

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

void __thiscall
LZ77Compressor::compress_helper<LZ77Compressor::DefaultEncode>
          (LZ77Compressor *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
          Item *items,int len,DefaultEncode *encode)

{
  Item item;
  int iVar1;
  int in_ECX;
  long in_RDX;
  int i_1;
  int i;
  uint8_t control;
  undefined4 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffca;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar2;
  uint3 in_stack_ffffffffffffffd4;
  anon_union_4_2_665c0628_for_Item_1 aVar3;
  
  aVar3.field_1.offset._1_1_ = 0;
  aVar3._0_3_ = in_stack_ffffffffffffffd4;
  for (iVar1 = 0; iVar1 < in_ECX; iVar1 = iVar1 + 1) {
    aVar3.field_1.offset._1_1_ =
         aVar3.field_1.offset._1_1_ |
         ((*(byte *)(in_RDX + (long)iVar1 * 6) & 1) != 0) << ((byte)iVar1 & 0x1f);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(aVar3,iVar1),
             (value_type_conflict1 *)
             CONCAT44(in_stack_ffffffffffffffcc,
                      CONCAT22(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8)));
  for (iVar2 = 0; iVar2 < in_ECX; iVar2 = iVar2 + 1) {
    item.field_1.field_1 = aVar3.field_1;
    item._0_2_ = (short)((uint)iVar1 >> 0x10);
    DefaultEncode::operator()
              ((DefaultEncode *)
               CONCAT44(iVar2,CONCAT22(in_stack_ffffffffffffffca,
                                       *(undefined2 *)(in_RDX + 4 + (long)iVar2 * 6))),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(*(undefined4 *)(in_RDX + (long)iVar2 * 6),in_stack_ffffffffffffffc0),item);
  }
  return;
}

Assistant:

void compress_helper(std::vector<uint8_t>& out, const Item* items, int len, Fn& encode) {
		uint8_t control = 0;
		for (int i = 0; i < len; i++) {
			control |= ((items[i].isRepeat ? 1 : 0) << i);
		}
		out.push_back(control);
		for (int i = 0; i < len; i++) {
			encode(out, items[i]);
		}
	}